

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_volumemeter.c
# Opt level: O0

void FAudioFXVolumeMeter_Process
               (FAudioFXVolumeMeter *fapo,uint32_t InputProcessParameterCount,
               FAPOProcessBufferParameters *pInputProcessParameters,
               uint32_t OutputProcessParameterCount,
               FAPOProcessBufferParameters *pOutputProcessParameters,int32_t IsEnabled)

{
  long *plVar1;
  long *in_RDX;
  FAPOBase *in_RDI;
  float fVar2;
  undefined4 uVar3;
  float sampleAbs;
  FAudioFXVolumeMeterLevels *levels;
  uint32_t j;
  uint32_t i;
  float *buffer;
  float total;
  float peak;
  uint local_48;
  uint local_44;
  float *local_40;
  float local_34;
  float local_30;
  
  plVar1 = (long *)FAPOBase_BeginProcess(in_RDI);
  for (local_44 = 0; local_44 < *(ushort *)&in_RDI[1].base.AddRef; local_44 = local_44 + 1) {
    local_30 = 0.0;
    local_34 = 0.0;
    local_40 = (float *)(*in_RDX + (ulong)local_44 * 4);
    for (local_48 = 0; local_48 < *(uint *)((long)in_RDX + 0xc); local_48 = local_48 + 1) {
      fVar2 = (float)SDL_fabsf(*local_40);
      if (local_30 < fVar2) {
        local_30 = fVar2;
      }
      local_34 = *local_40 * *local_40 + local_34;
      local_40 = local_40 + (int)(uint)*(ushort *)&in_RDI[1].base.AddRef;
    }
    *(float *)(*plVar1 + (ulong)local_44 * 4) = local_30;
    uVar3 = SDL_sqrtf(local_34 / (float)*(uint *)((long)in_RDX + 0xc));
    *(undefined4 *)(plVar1[1] + (ulong)local_44 * 4) = uVar3;
  }
  FAPOBase_EndProcess(in_RDI);
  return;
}

Assistant:

void FAudioFXVolumeMeter_Process(
	FAudioFXVolumeMeter *fapo,
	uint32_t InputProcessParameterCount,
	const FAPOProcessBufferParameters* pInputProcessParameters,
	uint32_t OutputProcessParameterCount,
	FAPOProcessBufferParameters* pOutputProcessParameters,
	int32_t IsEnabled
) {
	float peak;
	float total;
	float *buffer;
	uint32_t i, j;
	FAudioFXVolumeMeterLevels *levels = (FAudioFXVolumeMeterLevels*)
		FAPOBase_BeginProcess(&fapo->base);

	/* TODO: This could probably be SIMD-ified... */
	for (i = 0; i < fapo->channels; i += 1)
	{
		peak = 0.0f;
		total = 0.0f;
		buffer = ((float*) pInputProcessParameters->pBuffer) + i;
		for (j = 0; j < pInputProcessParameters->ValidFrameCount; j += 1, buffer += fapo->channels)
		{
			const float sampleAbs = FAudio_fabsf(*buffer);
			if (sampleAbs > peak)
			{
				peak = sampleAbs;
			}
			total += (*buffer) * (*buffer);
		}
		levels->pPeakLevels[i] = peak;
		levels->pRMSLevels[i] = FAudio_sqrtf(
			total / pInputProcessParameters->ValidFrameCount
		);
	}

	FAPOBase_EndProcess(&fapo->base);
}